

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<capnp::Capability::Client>::~ExceptionOr
          (ExceptionOr<capnp::Capability::Client> *this)

{
  ClientHook *pCVar1;
  Disposer *pDVar2;
  
  if (((this->value).ptr.isSet == true) &&
     (pCVar1 = (this->value).ptr.field_1.value.hook.ptr, pCVar1 != (ClientHook *)0x0)) {
    (this->value).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    pDVar2 = (this->value).ptr.field_1.value.hook.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;